

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws_map.c
# Opt level: O0

lws_map_item_t *
lws_map_item_create(lws_map_t *map,lws_map_key_t key,size_t keylen,lws_map_value_t value,
                   size_t valuelen)

{
  lws_map_hash_t lVar1;
  lws_map_item_t *item_00;
  uint8_t *u;
  size_t hti;
  lws_map_hash_t h;
  lws_map_item_t *item;
  lws_map_hashtable_t *ht;
  size_t valuelen_local;
  lws_map_value_t value_local;
  size_t keylen_local;
  lws_map_key_t key_local;
  lws_map_t *map_local;
  
  item_00 = lws_map_item_lookup(map,key,keylen);
  if (item_00 != (lws_map_item_t *)0x0) {
    lws_map_item_destroy(item_00);
  }
  map_local = (lws_map_t *)(*(map->info)._alloc)(map,keylen + 0x28 + valuelen);
  if ((lws_dll2 *)map_local == (lws_dll2 *)0x0) {
    map_local = (lws_map_t *)0x0;
  }
  else {
    lws_dll2_clear((lws_dll2 *)map_local);
    ((lws_dll2 *)((long)map_local + 0x18))->prev = (lws_dll2 *)keylen;
    ((lws_dll2 *)((long)map_local + 0x18))->next = (lws_dll2 *)valuelen;
    memcpy(&((lws_dll2 *)((long)map_local + 0x18))->owner,key,keylen);
    if (value != (lws_map_value_t)0x0) {
      memcpy((void *)(keylen + (long)&((lws_dll2 *)((long)map_local + 0x18))->owner),value,valuelen)
      ;
    }
    lVar1 = (*(map->info)._hash)(key,keylen);
    lws_dll2_add_head((lws_dll2 *)map_local,
                      (lws_dll2_owner *)
                      (&map[1].info._compare + ((ulong)lVar1 % (map->info).modulo) * 4));
  }
  return (lws_map_item_t *)map_local;
}

Assistant:

lws_map_item_t *
lws_map_item_create(lws_map_t *map,
		    const lws_map_key_t key, size_t keylen,
		    const lws_map_value_t value, size_t valuelen)
{
	lws_map_hashtable_t *ht;
	lws_map_item_t *item;
	lws_map_hash_t h;
	size_t hti;
	uint8_t *u;

	item = lws_map_item_lookup(map, key, keylen);
	if (item)
		lws_map_item_destroy(item);

	item = map->info._alloc(map, sizeof(*item) + keylen + valuelen);
	if (!item)
		return NULL;

	lws_dll2_clear(&item->list);
	item->keylen = keylen;
	item->valuelen = valuelen;

	u = (uint8_t *)&item[1];
	memcpy(u, key, keylen);
	u += keylen;
	if (value)
		memcpy(u, value, valuelen);

	h = map->info._hash(key, keylen);

	hti = h % map->info.modulo;
	ht = (lws_map_hashtable_t *)&map[1];

	lws_dll2_add_head(&item->list, &ht[hti].ho);

	return item;
}